

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

uint logdir_open(logdir *ld,char *fn)

{
  char cVar1;
  char *pcVar2;
  uint16_t uVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  bool bVar7;
  unsigned_long local_38;
  unsigned_long port;
  uint local_28;
  int c;
  int len;
  int i;
  char *fn_local;
  logdir *ld_local;
  
  _len = fn;
  fn_local = (char *)ld;
  iVar4 = open_read(fn);
  *(int *)fn_local = iVar4;
  if (iVar4 == -1) {
    warn2("unable to open log directory",_len);
    ld_local._4_4_ = 0;
  }
  else {
    coe(*(int *)fn_local);
    iVar4 = fchdir(*(int *)fn_local);
    if (iVar4 == -1) {
      logdir_close((logdir *)fn_local);
      warn2("unable to change directory",_len);
      ld_local._4_4_ = 0;
    }
    else {
      iVar4 = open_append("lock");
      *(int *)(fn_local + 0xc4) = iVar4;
      if ((*(int *)(fn_local + 0xc4) == -1) ||
         (iVar4 = lock_exnb(*(int *)(fn_local + 0xc4)), iVar4 == -1)) {
        logdir_close((logdir *)fn_local);
        warn2("unable to lock directory",_len);
        while (iVar4 = fchdir(fdwdir), iVar4 == -1) {
          pause1("unable to change to initial working directory");
        }
        ld_local._4_4_ = 0;
      }
      else {
        coe(*(int *)(fn_local + 0xc4));
        fn_local[0x40] = '\0';
        fn_local[0x41] = '\0';
        fn_local[0x42] = '\0';
        fn_local[0x43] = '\0';
        fn_local[0x44] = '\0';
        fn_local[0x45] = '\0';
        fn_local[0x46] = '\0';
        fn_local[0x47] = '\0';
        fn_local[0x48] = '@';
        fn_local[0x49] = 'B';
        fn_local[0x4a] = '\x0f';
        fn_local[0x4b] = '\0';
        fn_local[0x4c] = '\0';
        fn_local[0x4d] = '\0';
        fn_local[0x4e] = '\0';
        fn_local[0x4f] = '\0';
        fn_local[0x58] = '\n';
        fn_local[0x59] = '\0';
        fn_local[0x5a] = '\0';
        fn_local[0x5b] = '\0';
        fn_local[0x5c] = '\0';
        fn_local[0x5d] = '\0';
        fn_local[0x5e] = '\0';
        fn_local[0x5f] = '\0';
        fn_local[0x50] = '\n';
        fn_local[0x51] = '\0';
        fn_local[0x52] = '\0';
        fn_local[0x53] = '\0';
        fn_local[0x54] = '\0';
        fn_local[0x55] = '\0';
        fn_local[0x56] = '\0';
        fn_local[0x57] = '\0';
        fn_local[0x60] = '\0';
        fn_local[0x61] = '\0';
        fn_local[0x62] = '\0';
        fn_local[99] = '\0';
        fn_local[100] = '\0';
        fn_local[0x65] = '\0';
        fn_local[0x66] = '\0';
        fn_local[0x67] = '\0';
        *(char **)(fn_local + 0xb8) = _len;
        fn_local[0x90] = '\0';
        fn_local[0x91] = '\0';
        fn_local[0x92] = '\0';
        fn_local[0x93] = '\0';
        fn_local[200] = '+';
        fn_local[0xce] = '\0';
        fn_local[0xcf] = '\0';
        fn_local[0xdc] = '\0';
        fn_local[0xdd] = '\0';
        fn_local[0xde] = '\0';
        fn_local[0xdf] = '\0';
        while (iVar4 = stralloc_copys((stralloc *)(fn_local + 0xe0),""), iVar4 == 0) {
          pause_nomem();
        }
        while (iVar4 = stralloc_copys((stralloc *)(fn_local + 0x30),""), iVar4 == 0) {
          pause_nomem();
        }
        while (iVar4 = stralloc_copys((stralloc *)(fn_local + 0x80),""), iVar4 == 0) {
          pause_nomem();
        }
        c = openreadclose("config",&sa,0x80);
        if (c == -1) {
          warn2("unable to read config",*(char **)(fn_local + 0xb8));
        }
        if (c != 0) {
          if (verbose != 0) {
            strerr_warn("svlogd: info: ","read: ",*(char **)(fn_local + 0xb8),"/config",(char *)0x0,
                        (char *)0x0,(strerr *)0x0);
          }
          for (c = 0; c + 1U < sa.len; c = local_28 + c + 1) {
            local_28 = byte_chr(sa.s + c,sa.len - c,10);
            sa.s[(int)(local_28 + c)] = '\0';
            pcVar2 = sa.s;
            switch(sa.s[c]) {
            case '\n':
            case '#':
              break;
            case '!':
              if (1 < (int)local_28) {
                while (iVar4 = stralloc_copys((stralloc *)(fn_local + 0x80),sa.s + (c + 1)),
                      iVar4 == 0) {
                  pause_nomem();
                }
                while (iVar4 = stralloc_append((stralloc *)(fn_local + 0x80),""), iVar4 == 0) {
                  pause_nomem();
                }
              }
              break;
            case '+':
            case '-':
            case 'E':
            case 'e':
              while (iVar4 = stralloc_catb((stralloc *)(fn_local + 0x30),sa.s + c,local_28),
                    iVar4 == 0) {
                pause_nomem();
              }
              while (iVar4 = stralloc_append((stralloc *)(fn_local + 0x30),""), iVar4 == 0) {
                pause_nomem();
              }
              break;
            case 'N':
              scan_ulong(sa.s + (c + 1),(unsigned_long *)(fn_local + 0x58));
              break;
            case 'U':
              fn_local[0xdc] = '\x01';
              fn_local[0xdd] = '\0';
              fn_local[0xde] = '\0';
              fn_local[0xdf] = '\0';
            case 'u':
              port._4_4_ = ip4_scan(sa.s + (long)c + 1,fn_local + 0xd0);
              if (port._4_4_ == 0) {
                warnx("unable to scan ip address",sa.s + (long)c + 1);
              }
              else {
                if (sa.s[(int)(c + 1 + port._4_4_)] == ':') {
                  scan_ulong(sa.s + (long)(int)port._4_4_ + (long)c + 2,&local_38);
                  if (local_38 == 0) {
                    warnx("unable to scan port number",sa.s + (long)(int)port._4_4_ + (long)c + 2);
                    break;
                  }
                }
                else {
                  local_38 = 0x202;
                }
                uVar3 = htons((uint16_t)local_38);
                *(uint16_t *)(fn_local + 0xce) = uVar3;
              }
              break;
            case 'n':
              scan_ulong(sa.s + (c + 1),(unsigned_long *)(fn_local + 0x50));
              break;
            case 'p':
              if (1 < (int)local_28) {
                while (iVar4 = stralloc_copys((stralloc *)(fn_local + 0xe0),sa.s + (c + 1)),
                      iVar4 == 0) {
                  pause_nomem();
                }
                while (iVar4 = stralloc_append((stralloc *)(fn_local + 0xe0),""), iVar4 == 0) {
                  pause_nomem();
                }
              }
              break;
            case 's':
              uVar5 = scan_ulong(sa.s + (long)c + 1,(unsigned_long *)(fn_local + 0x48));
              cVar1 = pcVar2[uVar5 + 1 + c];
              if (cVar1 == 'k') {
                *(long *)(fn_local + 0x48) = *(long *)(fn_local + 0x48) << 10;
              }
              else if (cVar1 == 'm') {
                *(long *)(fn_local + 0x48) = *(long *)(fn_local + 0x48) << 0x14;
              }
              break;
            case 't':
              uVar5 = scan_ulong(sa.s + (long)c + 1,(unsigned_long *)(fn_local + 0x60));
              cVar1 = pcVar2[uVar5 + 1 + c];
              if (cVar1 == 'd') {
                *(long *)(fn_local + 0x60) = *(long *)(fn_local + 0x60) * 0x15180;
              }
              else if (cVar1 == 'h') {
                *(long *)(fn_local + 0x60) = *(long *)(fn_local + 0x60) * 0xe10;
              }
              else if (cVar1 == 'm') {
                *(long *)(fn_local + 0x60) = *(long *)(fn_local + 0x60) * 0x3c;
              }
              if (*(long *)(fn_local + 0x60) != 0) {
                taia_uint((taia *)(fn_local + 0x68),(uint)*(undefined8 *)(fn_local + 0x60));
                taia_add((taia *)(fn_local + 0x68),&now,(taia *)(fn_local + 0x68));
                if ((tmaxflag == 0) ||
                   (iVar4 = taia_less((taia *)(fn_local + 0x68),&trotate), iVar4 != 0)) {
                  trotate.sec.x = *(uint64 *)(fn_local + 0x68);
                  trotate.nano = *(unsigned_long *)(fn_local + 0x70);
                  trotate.atto = *(unsigned_long *)(fn_local + 0x78);
                }
                tmaxflag = 1;
              }
            }
          }
        }
        c = stat("current",(stat *)&st);
        if (c == -1) {
          piVar6 = __errno_location();
          if (*piVar6 != error_noent) {
            logdir_close((logdir *)fn_local);
            warn2("unable to stat current",*(char **)(fn_local + 0xb8));
            while (iVar4 = fchdir(fdwdir), iVar4 == -1) {
              pause1("unable to change to initial working directory");
            }
            return 0;
          }
        }
        else if ((st.st_size == 0) || ((st.st_mode & 0x40) != 0)) {
          *(__off_t *)(fn_local + 0x40) = st.st_size;
        }
        else {
          fn_local[0xad] = '.';
          fn_local[0xae] = 'u';
          fn_local[0xaf] = '\0';
          do {
            taia_now(&now);
            fmt_taia(fn_local + 0x94,&now);
            piVar6 = __errno_location();
            *piVar6 = 0;
            iVar4 = stat(fn_local + 0x94,(stat *)&st);
            bVar7 = true;
            if (iVar4 == -1) {
              piVar6 = __errno_location();
              bVar7 = *piVar6 != error_noent;
            }
          } while (bVar7);
          while (iVar4 = rename("current",fn_local + 0x94), iVar4 == -1) {
            pause2("unable to rename current",*(char **)(fn_local + 0xb8));
          }
          rmoldest((logdir *)fn_local);
          c = -1;
        }
        while( true ) {
          iVar4 = open_append("current");
          *(int *)(fn_local + 0xc0) = iVar4;
          if (iVar4 != -1) break;
          pause2("unable to open current",*(char **)(fn_local + 0xb8));
        }
        coe(*(int *)(fn_local + 0xc0));
        while (iVar4 = fchmod(*(int *)(fn_local + 0xc0),0x1a4), iVar4 == -1) {
          pause2("unable to set mode of current",*(char **)(fn_local + 0xb8));
        }
        buffer_init((buffer *)(fn_local + 0x10),buffer_pwrite,
                    (int)(((long)fn_local - (long)dir) / 0xf0),*(char **)(fn_local + 8),(uint)buflen
                   );
        if (verbose != 0) {
          if (c == 0) {
            strerr_warn("svlogd: info: ","append: ",*(char **)(fn_local + 0xb8),"/current",
                        (char *)0x0,(char *)0x0,(strerr *)0x0);
          }
          else {
            strerr_warn("svlogd: info: ","new: ",*(char **)(fn_local + 0xb8),"/current",(char *)0x0,
                        (char *)0x0,(strerr *)0x0);
          }
        }
        while (iVar4 = fchdir(fdwdir), iVar4 == -1) {
          pause1("unable to change to initial working directory");
        }
        ld_local._4_4_ = 1;
      }
    }
  }
  return ld_local._4_4_;
}

Assistant:

unsigned int logdir_open(struct logdir *ld, const char *fn) {
  int i;

  if ((ld->fddir =open_read(fn)) == -1) {
    warn2("unable to open log directory", (char*)fn);
    return(0);
  }
  coe(ld->fddir);
  if (fchdir(ld->fddir) == -1) {
    logdir_close(ld);
    warn2("unable to change directory", (char*)fn);
    return(0);
  }
  ld->fdlock =open_append("lock");
  if ((ld->fdlock == -1) || (lock_exnb(ld->fdlock) == -1)) {
    logdir_close(ld);
    warn2("unable to lock directory", (char*)fn);
    while (fchdir(fdwdir) == -1)
      pause1("unable to change to initial working directory");
    return(0);
  }
  coe(ld->fdlock);

  ld->size =0;
  ld->sizemax =1000000;
  ld->nmax =ld->nmin =10;
  ld->tmax =0;
  ld->name =(char*)fn;
  ld->ppid =0;
  ld->match ='+';
  ld->udpaddr.sin_port =0;
  ld->udponly =0;
  while (! stralloc_copys(&ld->prefix, "")) pause_nomem();
  while (! stralloc_copys(&ld->inst, "")) pause_nomem();
  while (! stralloc_copys(&ld->processor, "")) pause_nomem();

  /* read config */
  if ((i =openreadclose("config", &sa, 128)) == -1)
    warn2("unable to read config", ld->name);
  if (i != 0) {
    int len, c;
    unsigned long port;

    if (verbose) strerr_warn4(INFO, "read: ", ld->name, "/config", 0);
    for (i =0; i +1 < sa.len; ++i) {
      len =byte_chr(&sa.s[i], sa.len -i, '\n');
      sa.s[len +i] =0;
      switch(sa.s[i]) {
      case '\n':
      case '#':
         break;
      case '+':
      case '-':
      case 'e':
      case 'E':
        while (! stralloc_catb(&ld->inst, &sa.s[i], len)) pause_nomem();
        while (! stralloc_0(&ld->inst)) pause_nomem();
        break;
      case 's':
        /* Handle modifiers.  Do this the right way with breaks and all */
        switch (sa.s[scan_ulong(&sa.s[i +1], &ld->sizemax) +i +1]) {
          case 'm': ld->sizemax *= 1024 * 1024; break;
          case 'k': ld->sizemax *= 1024; break;
        }
        break;
      case 'n':
        scan_ulong(&sa.s[i +1], &ld->nmax);
        break;
      case 'N':
        scan_ulong(&sa.s[i +1], &ld->nmin);
        break;
      case 't':
        /* Handle modifiers.  Do this the right way with breaks and all */
        switch (sa.s[scan_ulong(&sa.s[i +1], &ld->tmax) +i +1]) {        
            case 'd': ld->tmax *= (24 * 60 * 60); break;
            case 'h': ld->tmax *= (60 * 60); break;
            case 'm': ld->tmax *= 60; break;
        }
        if (ld->tmax) {
          taia_uint(&ld->trotate, ld->tmax);
          taia_add(&ld->trotate, &now, &ld->trotate);
          if (! tmaxflag || taia_less(&ld->trotate, &trotate))
            trotate =ld->trotate;
          tmaxflag =1;
        }
        break;
      case '!':
        if (len > 1) {
          while (! stralloc_copys(&ld->processor, &sa.s[i +1])) pause_nomem();
          while (! stralloc_0(&ld->processor)) pause_nomem();
        }
        break;
      case 'U':
        ld->udponly =1;
      case 'u':
        if (! (c =ip4_scan(sa.s +i +1, (char *)&ld->udpaddr.sin_addr))) {
          warnx("unable to scan ip address", sa.s +i +1);
          break;
        }
        if (sa.s[i +1 +c] == ':') {
          scan_ulong(sa.s +i +c +2, &port);
          if (port == 0) {
            warnx("unable to scan port number", sa.s +i +c +2);
            break;
          }
        }
        else
          port =514;
        ld->udpaddr.sin_port =htons(port);
        break;
      case 'p':
        if (len > 1) {
          while (! stralloc_copys(&ld->prefix, &sa.s[i +1])) pause_nomem();
          while (! stralloc_0(&ld->prefix)) pause_nomem();
        }
        break;
      }
      i +=len;
    }
  }

  /* open current */
  if ((i =stat("current", &st)) != -1) {
    if (st.st_size && ! (st.st_mode & S_IXUSR)) {
      ld->fnsave[25] ='.'; ld->fnsave[26] ='u'; ld->fnsave[27] =0;
      do {
        taia_now(&now);
        fmt_taia(ld->fnsave, &now);
        errno =0;
      } while ((stat(ld->fnsave, &st) != -1) || (errno != error_noent));
      while (rename("current", ld->fnsave) == -1)
        pause2("unable to rename current", ld->name);
      rmoldest(ld);
      i =-1;
    }
    else
      ld->size =st.st_size;
  }
  else
    if (errno != error_noent) {
      logdir_close(ld);
      warn2("unable to stat current", ld->name);
      while (fchdir(fdwdir) == -1)
        pause1("unable to change to initial working directory");
      return(0);
    }
  while ((ld->fdcur =open_append("current")) == -1)
    pause2("unable to open current", ld->name);
  coe(ld->fdcur);
  while (fchmod(ld->fdcur, 0644) == -1)
    pause2("unable to set mode of current", ld->name);
  buffer_init(&ld->b, buffer_pwrite, ld -dir, ld->btmp, buflen);

  if (verbose) {
    if (i == 0) strerr_warn4(INFO, "append: ", ld->name, "/current", 0);
    else strerr_warn4(INFO, "new: ", ld->name, "/current", 0);
  }

  while (fchdir(fdwdir) == -1)
    pause1("unable to change to initial working directory");
  return(1);
}